

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,REF_LIST original)

{
  REF_LIST pRVar1;
  REF_INT *pRVar2;
  int local_2c;
  REF_INT i;
  REF_LIST ref_list;
  REF_LIST original_local;
  REF_LIST *ref_list_ptr_local;
  
  pRVar1 = (REF_LIST)malloc(0x10);
  *ref_list_ptr = pRVar1;
  if (*ref_list_ptr == (REF_LIST)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x36,
           "ref_list_deep_copy","malloc *ref_list_ptr of REF_LIST_STRUCT NULL");
    ref_list_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_list_ptr;
    pRVar1->n = original->n;
    pRVar1->max = original->max;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x3c,
             "ref_list_deep_copy","malloc ref_list->value of REF_INT negative");
      ref_list_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->max << 2);
      pRVar1->value = pRVar2;
      if (pRVar1->value == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x3c
               ,"ref_list_deep_copy","malloc ref_list->value of REF_INT NULL");
        ref_list_ptr_local._4_4_ = 2;
      }
      else {
        for (local_2c = 0; local_2c < pRVar1->n; local_2c = local_2c + 1) {
          pRVar1->value[local_2c] = original->value[local_2c];
        }
        ref_list_ptr_local._4_4_ = 0;
      }
    }
  }
  return ref_list_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,
                                      REF_LIST original) {
  REF_LIST ref_list;
  REF_INT i;

  ref_malloc(*ref_list_ptr, 1, REF_LIST_STRUCT);
  ref_list = (*ref_list_ptr);

  ref_list_n(ref_list) = ref_list_n(original);
  ref_list_max(ref_list) = ref_list_max(original);

  ref_malloc(ref_list->value, ref_list_max(ref_list), REF_INT);
  for (i = 0; i < ref_list_n(ref_list); i++)
    ref_list->value[i] = original->value[i];

  return REF_SUCCESS;
}